

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesNH3
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command_conflict *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  uint8_t *puVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ushort uVar6;
  size_t sVar7;
  uint8_t uVar8;
  uint uVar9;
  ulong uVar10;
  uint8_t *puVar11;
  ulong uVar12;
  ulong uVar13;
  byte bVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  size_t sVar22;
  long lVar23;
  uint uVar24;
  size_t sVar25;
  ushort uVar26;
  uint32_t uVar27;
  uint *puVar28;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  uint uVar32;
  uint32_t uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  Command_conflict *local_d0;
  ulong local_c0;
  size_t local_b0;
  uint local_68;
  
  uVar4 = (position - 7) + num_bytes;
  sVar22 = position;
  if (7 < num_bytes) {
    sVar22 = uVar4;
  }
  lVar23 = 0x200;
  if (params->quality < 9) {
    lVar23 = 0x40;
  }
  local_b0 = *last_insert_len;
  uVar1 = position + num_bytes;
  if (uVar1 <= position + 8) {
    local_d0 = commands;
LAB_0010f5b6:
    *last_insert_len = (local_b0 + uVar1) - position;
    *num_commands = *num_commands + ((long)local_d0 - (long)commands >> 4);
    return;
  }
  uVar37 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar12 = lVar23 + position;
  lVar3 = position - 1;
  local_d0 = commands;
  sVar25 = position;
LAB_0010eafe:
  local_f8 = uVar1 - sVar25;
  uVar13 = uVar37;
  if (sVar25 < uVar37) {
    uVar13 = sVar25;
  }
  uVar10 = sVar25 & ringbuffer_mask;
  puVar2 = ringbuffer + uVar10;
  local_e0 = (ulong)*dist_cache;
  local_c0 = 0x7e4;
  local_68 = (uint)ringbuffer_mask;
  uVar8 = (uint8_t)*(long *)(ringbuffer + uVar10);
  if ((sVar25 - local_e0 < sVar25) &&
     (uVar18 = (ulong)((uint)(sVar25 - local_e0) & local_68), ringbuffer[uVar18] == uVar8)) {
    if (7 < local_f8) {
      uVar16 = local_f8 & 0xfffffffffffffff8;
      puVar11 = ringbuffer + uVar16 + uVar10;
      lVar17 = 0;
      uVar34 = 0;
LAB_0010eba2:
      if (*(ulong *)(puVar2 + uVar34 * 8) == *(ulong *)(ringbuffer + uVar34 * 8 + uVar18))
      goto code_r0x0010ebaf;
      uVar16 = *(ulong *)(ringbuffer + uVar34 * 8 + uVar18) ^ *(ulong *)(puVar2 + uVar34 * 8);
      uVar18 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
        }
      }
      uVar34 = (uVar18 >> 3 & 0x1fffffff) - lVar17;
      goto LAB_0010ebe7;
    }
    uVar16 = 0;
    puVar11 = puVar2;
LAB_0010f577:
    uVar19 = local_f8 & 7;
    uVar34 = uVar16;
    if (uVar19 != 0) {
      uVar29 = uVar16 | uVar19;
      do {
        uVar34 = uVar16;
        if (ringbuffer[uVar16 + uVar18] != *puVar11) break;
        puVar11 = puVar11 + 1;
        uVar16 = uVar16 + 1;
        uVar19 = uVar19 - 1;
        uVar34 = uVar29;
      } while (uVar19 != 0);
    }
LAB_0010ebe7:
    if ((uVar34 < 4) || (uVar18 = uVar34 * 0x87 + 0x78f, uVar18 < 0x7e5)) goto LAB_0010ec11;
    uVar8 = puVar2[uVar34];
    local_c0 = uVar18;
  }
  else {
LAB_0010ec11:
    local_e0 = 0;
    uVar34 = 0;
  }
  uVar16 = *(long *)(ringbuffer + uVar10) * -0x42e1ca5843000000;
  puVar28 = (uint *)(hasher + (uVar16 >> 0x30) * 4 + 0x28);
  uVar18 = (ulong)((uint)local_f8 & 7);
  bVar31 = true;
  do {
    bVar30 = bVar31;
    uVar24 = *puVar28;
    uVar9 = local_68 & uVar24;
    if (((uVar8 == ringbuffer[uVar34 + uVar9]) && (sVar25 != uVar24)) &&
       (uVar19 = sVar25 - uVar24, uVar19 <= uVar13)) {
      if (7 < local_f8) {
        lVar17 = 0;
        uVar29 = 0;
LAB_0010eca7:
        if (*(ulong *)(puVar2 + uVar29 * 8) == *(ulong *)(ringbuffer + uVar29 * 8 + (ulong)uVar9))
        goto code_r0x0010ecb4;
        uVar38 = *(ulong *)(ringbuffer + uVar29 * 8 + (ulong)uVar9) ^
                 *(ulong *)(puVar2 + uVar29 * 8);
        uVar29 = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        uVar29 = (uVar29 >> 3 & 0x1fffffff) - lVar17;
        goto LAB_0010ecf0;
      }
      puVar11 = puVar2;
      uVar38 = 0;
LAB_0010ed41:
      uVar29 = uVar38;
      if (uVar18 != 0) {
        uVar35 = uVar18 | uVar38;
        uVar36 = uVar18;
        do {
          uVar29 = uVar38;
          if (ringbuffer[uVar38 + uVar9] != *puVar11) break;
          puVar11 = puVar11 + 1;
          uVar38 = uVar38 + 1;
          uVar36 = uVar36 - 1;
          uVar29 = uVar35;
        } while (uVar36 != 0);
      }
LAB_0010ecf0:
      if (3 < uVar29) {
        iVar21 = 0x1f;
        if ((uint)uVar19 != 0) {
          for (; (uint)uVar19 >> iVar21 == 0; iVar21 = iVar21 + -1) {
          }
        }
        uVar38 = (ulong)(iVar21 * -0x1e + 0x780) + uVar29 * 0x87;
        if (local_c0 < uVar38) {
          uVar8 = puVar2[uVar29];
          uVar34 = uVar29;
          local_e0 = uVar19;
          local_c0 = uVar38;
        }
      }
    }
    puVar28 = puVar28 + 1;
    bVar31 = false;
  } while (bVar30);
  *(uint *)(hasher + (ulong)(((uint)(ushort)(uVar16 >> 0x30) + (uint)(((uint)sVar25 >> 3 & 1) != 0))
                            * 4) + 0x28) = (uint)sVar25;
  if (0x7e4 < local_c0) {
    iVar21 = *dist_cache;
    uVar12 = local_b0 + 4;
    uVar13 = (lVar3 + num_bytes) - sVar25;
    iVar15 = 0;
LAB_0010edde:
    local_f8 = local_f8 - 1;
    uVar10 = uVar34 - 1;
    if (local_f8 <= uVar34 - 1) {
      uVar10 = local_f8;
    }
    if (4 < params->quality) {
      uVar10 = 0;
    }
    uVar18 = sVar25 + 1;
    local_e8 = uVar37;
    if (uVar18 < uVar37) {
      local_e8 = uVar18;
    }
    puVar2 = ringbuffer + (uVar18 & ringbuffer_mask);
    uVar8 = puVar2[uVar10];
    uVar19 = uVar18 - (long)iVar21;
    uVar16 = 0x7e4;
    if ((uVar19 < uVar18) &&
       (uVar24 = (uint)uVar19 & local_68, uVar8 == ringbuffer[uVar10 + uVar24])) {
      if (7 < local_f8) {
        lVar17 = 0;
        uVar19 = 0;
LAB_0010ee71:
        if (*(ulong *)(puVar2 + uVar19 * 8) == *(ulong *)(ringbuffer + uVar19 * 8 + (ulong)uVar24))
        goto code_r0x0010ee7e;
        uVar29 = *(ulong *)(ringbuffer + uVar19 * 8 + (ulong)uVar24) ^
                 *(ulong *)(puVar2 + uVar19 * 8);
        uVar19 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        uVar19 = (uVar19 >> 3 & 0x1fffffff) - lVar17;
        goto LAB_0010eeb4;
      }
      uVar19 = 0;
      puVar11 = puVar2;
      goto LAB_0010f09f;
    }
    goto LAB_0010eee7;
  }
  local_b0 = local_b0 + 1;
  position = sVar25 + 1;
  if (uVar12 < position) {
    if ((uint)((int)lVar23 * 4) + uVar12 < position) {
      uVar13 = sVar25 + 0x11;
      if (uVar4 <= sVar25 + 0x11) {
        uVar13 = uVar4;
      }
      for (; position < uVar13; position = position + 4) {
        *(uint *)(hasher + (ulong)(((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                    (position & ringbuffer_mask)) *
                                                          -0x42e1ca5843000000) >> 0x30) +
                                   (uint)(((uint)position >> 3 & 1) != 0)) * 4) + 0x28) =
             (uint)position;
        local_b0 = local_b0 + 4;
      }
    }
    else {
      uVar13 = sVar25 + 9;
      if (uVar4 <= sVar25 + 9) {
        uVar13 = uVar4;
      }
      for (; position < uVar13; position = position + 2) {
        *(uint *)(hasher + (ulong)(((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                    (position & ringbuffer_mask)) *
                                                          -0x42e1ca5843000000) >> 0x30) +
                                   (uint)(((uint)position >> 3 & 1) != 0)) * 4) + 0x28) =
             (uint)position;
        local_b0 = local_b0 + 2;
      }
    }
  }
  goto LAB_0010f513;
code_r0x0010ebaf:
  uVar34 = uVar34 + 1;
  lVar17 = lVar17 + -8;
  if (local_f8 >> 3 == uVar34) goto LAB_0010f577;
  goto LAB_0010eba2;
code_r0x0010ecb4:
  uVar29 = uVar29 + 1;
  lVar17 = lVar17 + -8;
  puVar11 = ringbuffer + (local_f8 & 0xfffffffffffffff8) + uVar10;
  uVar38 = local_f8 & 0xfffffffffffffff8;
  if (local_f8 >> 3 == uVar29) goto LAB_0010ed41;
  goto LAB_0010eca7;
code_r0x0010ee7e:
  uVar19 = uVar19 + 1;
  lVar17 = lVar17 + -8;
  if (uVar13 >> 3 == uVar19) goto code_r0x0010ee8c;
  goto LAB_0010ee71;
code_r0x0010ee8c:
  uVar19 = -lVar17;
  puVar11 = puVar2 + -lVar17;
LAB_0010f09f:
  uVar29 = local_f8 & 7;
  for (; (uVar29 != 0 && (ringbuffer[uVar19 + uVar24] == *puVar11)); uVar19 = uVar19 + 1) {
    puVar11 = puVar11 + 1;
    uVar29 = uVar29 - 1;
  }
LAB_0010eeb4:
  if ((uVar19 < 4) || (uVar29 = uVar19 * 0x87 + 0x78f, uVar29 < 0x7e5)) {
LAB_0010eee7:
    local_f0 = 0;
  }
  else {
    uVar8 = puVar2[uVar19];
    uVar10 = uVar19;
    uVar16 = uVar29;
    local_f0 = (long)iVar21;
  }
  puVar28 = (uint *)(hasher + ((ulong)(*(long *)(ringbuffer + (uVar18 & ringbuffer_mask)) *
                                      -0x42e1ca5843000000) >> 0x30) * 4 + 0x28);
  uVar19 = (ulong)((uint)local_f8 & 7);
  bVar31 = true;
LAB_0010ef23:
  uVar24 = *puVar28;
  uVar9 = local_68 & uVar24;
  if (((uVar8 == ringbuffer[uVar10 + uVar9]) && (uVar18 != uVar24)) &&
     (uVar29 = uVar18 - uVar24, uVar29 <= local_e8)) {
    uVar38 = uVar19;
    if (7 < local_f8) {
      lVar17 = 0;
      uVar36 = 0;
LAB_0010ef68:
      if (*(ulong *)(puVar2 + uVar36 * 8) == *(ulong *)(ringbuffer + uVar36 * 8 + (ulong)uVar9))
      goto code_r0x0010ef75;
      uVar36 = *(ulong *)(ringbuffer + uVar36 * 8 + (ulong)uVar9) ^ *(ulong *)(puVar2 + uVar36 * 8);
      uVar38 = 0;
      if (uVar36 != 0) {
        for (; (uVar36 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
        }
      }
      uVar36 = (uVar38 >> 3 & 0x1fffffff) - lVar17;
      goto LAB_0010ef9e;
    }
    uVar36 = 0;
    puVar11 = puVar2;
    goto joined_r0x0010eff8;
  }
  goto LAB_0010efda;
code_r0x0010ef75:
  uVar36 = uVar36 + 1;
  lVar17 = lVar17 + -8;
  if (uVar13 >> 3 == uVar36) goto code_r0x0010ef83;
  goto LAB_0010ef68;
code_r0x0010ef83:
  uVar36 = -lVar17;
  puVar11 = puVar2 + -lVar17;
joined_r0x0010eff8:
  for (; (uVar38 != 0 && (ringbuffer[uVar36 + uVar9] == *puVar11)); uVar36 = uVar36 + 1) {
    puVar11 = puVar11 + 1;
    uVar38 = uVar38 - 1;
  }
LAB_0010ef9e:
  if (3 < uVar36) {
    iVar5 = 0x1f;
    if ((uint)uVar29 != 0) {
      for (; (uint)uVar29 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    uVar38 = (ulong)(iVar5 * -0x1e + 0x780) + uVar36 * 0x87;
    if (uVar16 < uVar38) {
      uVar8 = puVar2[uVar36];
      uVar10 = uVar36;
      uVar16 = uVar38;
      local_f0 = uVar29;
    }
  }
LAB_0010efda:
  puVar28 = puVar28 + 1;
  bVar30 = !bVar31;
  bVar31 = false;
  if (bVar30) goto LAB_0010f012;
  goto LAB_0010ef23;
LAB_0010f012:
  *(uint *)(hasher + (ulong)(((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                              (uVar18 & ringbuffer_mask)) *
                                                    -0x42e1ca5843000000) >> 0x30) +
                             (uint)(((uint)uVar18 >> 3 & 1) != 0)) * 4) + 0x28) = (uint)uVar18;
  if (uVar16 < local_c0 + 0xaf) {
    uVar18 = sVar25;
    uVar10 = uVar34;
    local_e8 = uVar37;
    sVar7 = local_b0;
    if (sVar25 < uVar37) {
      local_e8 = sVar25;
    }
    goto LAB_0010f1a8;
  }
  local_e0 = local_f0;
  sVar7 = uVar12;
  if (iVar15 == 3) goto LAB_0010f1a8;
  local_b0 = local_b0 + 1;
  iVar15 = iVar15 + 1;
  uVar19 = sVar25 + 9;
  uVar13 = uVar13 - 1;
  uVar34 = uVar10;
  sVar25 = uVar18;
  local_c0 = uVar16;
  sVar7 = local_b0;
  if (uVar1 <= uVar19) goto LAB_0010f1a8;
  goto LAB_0010edde;
LAB_0010f1a8:
  local_b0 = sVar7;
  uVar24 = (uint)local_b0;
  uVar33 = (uint32_t)uVar10;
  if (local_e8 < local_e0) {
LAB_0010f1c0:
    uVar12 = local_e0 + 0xf;
  }
  else {
    if (local_e0 == (long)*dist_cache) {
      local_d0->insert_len_ = uVar24;
      local_d0->copy_len_ = uVar33;
      uVar9 = 0;
      uVar27 = 0;
      goto LAB_0010f2ad;
    }
    uVar12 = 1;
    if (local_e0 != (long)dist_cache[1]) {
      uVar12 = (local_e0 + 3) - (long)*dist_cache;
      if (uVar12 < 7) {
        bVar14 = (byte)((int)uVar12 << 2);
        uVar9 = 0x9750468;
      }
      else {
        uVar12 = (local_e0 + 3) - (long)dist_cache[1];
        if (6 < uVar12) {
          uVar12 = 2;
          if ((local_e0 != (long)dist_cache[2]) && (uVar12 = 3, local_e0 != (long)dist_cache[3]))
          goto LAB_0010f1c0;
          goto LAB_0010f1c4;
        }
        bVar14 = (byte)((int)uVar12 << 2);
        uVar9 = 0xfdb1ace;
      }
      uVar12 = (ulong)(uVar9 >> (bVar14 & 0x1f) & 0xf);
    }
  }
LAB_0010f1c4:
  if ((local_e0 <= local_e8) && (uVar12 != 0)) {
    dist_cache[3] = dist_cache[2];
    *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
    *dist_cache = (int)local_e0;
  }
  local_d0->insert_len_ = uVar24;
  local_d0->copy_len_ = uVar33;
  uVar16 = (ulong)(params->dist).num_direct_distance_codes;
  uVar13 = uVar16 + 0x10;
  uVar27 = 0;
  if (uVar13 <= uVar12) {
    uVar9 = (params->dist).distance_postfix_bits;
    bVar14 = (byte)uVar9;
    uVar16 = ((4L << (bVar14 & 0x3f)) + (uVar12 - uVar16)) - 0x10;
    uVar32 = 0x1f;
    uVar20 = (uint)uVar16;
    if (uVar20 != 0) {
      for (; uVar20 >> uVar32 == 0; uVar32 = uVar32 - 1) {
      }
    }
    uVar32 = (uVar32 ^ 0xffffffe0) + 0x1f;
    uVar34 = (ulong)((uVar16 >> ((ulong)uVar32 & 0x3f) & 1) != 0);
    lVar17 = (ulong)uVar32 - (ulong)uVar9;
    uVar12 = (~(-1 << (bVar14 & 0x1f)) & uVar20) + uVar13 +
             (uVar34 + lVar17 * 2 + 0xfffe << (bVar14 & 0x3f)) | lVar17 * 0x400;
    uVar27 = (uint32_t)(uVar16 - (uVar34 + 2 << ((byte)uVar32 & 0x3f)) >> (bVar14 & 0x3f));
  }
  uVar9 = (uint)uVar12;
LAB_0010f2ad:
  local_d0->dist_prefix_ = (uint16_t)uVar9;
  local_d0->dist_extra_ = uVar27;
  if (5 < local_b0) {
    if (local_b0 < 0x82) {
      uVar24 = 0x1f;
      uVar32 = (uint)(local_b0 - 2);
      if (uVar32 != 0) {
        for (; uVar32 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      uVar24 = (int)(local_b0 - 2 >> ((char)(uVar24 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar24 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_b0 < 0x842) {
      uVar32 = 0x1f;
      if (uVar24 - 0x42 != 0) {
        for (; uVar24 - 0x42 >> uVar32 == 0; uVar32 = uVar32 - 1) {
        }
      }
      uVar24 = (uVar32 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar24 = 0x15;
      if (0x1841 < local_b0) {
        uVar24 = (uint)(ushort)(0x17 - (local_b0 < 0x5842));
      }
    }
  }
  uVar12 = (ulong)(int)uVar33;
  if (uVar12 < 10) {
    uVar32 = uVar33 - 2;
  }
  else if (uVar12 < 0x86) {
    uVar32 = 0x1f;
    uVar20 = (uint)(uVar12 - 6);
    if (uVar20 != 0) {
      for (; uVar20 >> uVar32 == 0; uVar32 = uVar32 - 1) {
      }
    }
    uVar32 = (int)(uVar12 - 6 >> ((char)(uVar32 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar32 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar32 = 0x17;
    if (uVar12 < 0x846) {
      uVar32 = 0x1f;
      if (uVar33 - 0x46 != 0) {
        for (; uVar33 - 0x46 >> uVar32 == 0; uVar32 = uVar32 - 1) {
        }
      }
      uVar32 = (uVar32 ^ 0xffe0) + 0x2c;
    }
  }
  uVar6 = (ushort)uVar32;
  uVar26 = (uVar6 & 7) + ((ushort)uVar24 & 7) * 8;
  if ((((uVar9 & 0x3ff) == 0) && ((ushort)uVar24 < 8)) && (uVar6 < 0x10)) {
    if (7 < uVar6) {
      uVar26 = uVar26 | 0x40;
    }
  }
  else {
    iVar21 = ((uVar24 & 0xffff) >> 3) * 3 + ((uVar32 & 0xffff) >> 3);
    uVar26 = uVar26 + ((ushort)(0x520d40 >> ((char)iVar21 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar21 * 0x40 + 0x40;
  }
  local_d0->cmd_prefix_ = uVar26;
  *num_literals = *num_literals + local_b0;
  position = uVar10 + uVar18;
  uVar13 = sVar22;
  if (position < sVar22) {
    uVar13 = position;
  }
  uVar16 = uVar18 + 2;
  if (local_e0 < uVar10 >> 2) {
    uVar12 = position + local_e0 * -4;
    if (uVar12 < uVar16) {
      uVar12 = uVar16;
    }
    uVar16 = uVar12;
    if (uVar13 < uVar12) {
      uVar16 = uVar13;
    }
  }
  uVar12 = uVar18 + lVar23 + uVar10 * 2;
  local_d0 = local_d0 + 1;
  if (uVar16 < uVar13) {
    do {
      *(uint *)(hasher + (ulong)(((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                  (uVar16 & ringbuffer_mask)) *
                                                        -0x42e1ca5843000000) >> 0x30) +
                                 (uint)(((uint)uVar16 >> 3 & 1) != 0)) * 4) + 0x28) = (uint)uVar16;
      uVar16 = uVar16 + 1;
    } while (uVar13 != uVar16);
    local_b0 = 0;
  }
  else {
    local_b0 = 0;
  }
LAB_0010f513:
  sVar25 = position;
  if (uVar1 <= position + 8) goto LAB_0010f5b6;
  goto LAB_0010eafe;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}